

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall
Units_compareCompatibleSameSizeButDifferentExponent_Test::
~Units_compareCompatibleSameSizeButDifferentExponent_Test
          (Units_compareCompatibleSameSizeButDifferentExponent_Test *this)

{
  Units_compareCompatibleSameSizeButDifferentExponent_Test *this_local;
  
  ~Units_compareCompatibleSameSizeButDifferentExponent_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, compareCompatibleSameSizeButDifferentExponent)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("u1");
    u1->addUnit(libcellml::Units::StandardUnit::AMPERE, 0, 1.0, 1.0);

    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("u2");
    u2->addUnit(libcellml::Units::StandardUnit::AMPERE, 0, 2.0, 1.0);

    EXPECT_FALSE(libcellml::Units::compatible(u1, u2));
    EXPECT_FALSE(libcellml::Units::compatible(u2, u1));
}